

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t
flatcc_builder_embed_buffer
          (flatcc_builder_t *B,uint16_t block_align,void *data,size_t size,uint16_t align,
          flatcc_builder_buffer_flags_t flags)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  flatbuffers_uoffset_t size_field;
  flatcc_iov_state_t iov;
  int local_c8;
  ushort local_c2;
  ulong local_c0;
  uint local_b8;
  flatcc_iovec_t local_b0 [8];
  
  local_c2 = align;
  align_buffer_end(B,&local_c2,block_align,(uint)(B->nest_id != 0));
  iVar4 = B->emit_start;
  uVar1 = local_c2 - 1 & iVar4 - ((int)size + (flags & 2) * 2);
  local_c8 = uVar1 + (int)size;
  local_c0 = 0;
  bVar5 = B->nest_id != 0;
  if (bVar5) {
    local_c0 = 4;
    local_b0[0].iov_len = 4;
    local_b0[0].iov_base = &local_c8;
  }
  local_b8 = (uint)bVar5;
  if (size != 0) {
    local_c0 = local_c0 + size;
    lVar3 = (long)(int)local_b8;
    local_b8 = local_b8 + 1;
    local_b0[lVar3].iov_base = data;
    local_b0[lVar3].iov_len = size;
  }
  if (uVar1 != 0) {
    local_c0 = local_c0 + uVar1;
    lVar3 = (long)(int)local_b8;
    local_b8 = local_b8 + 1;
    local_b0[lVar3].iov_base = "";
    local_b0[lVar3].iov_len = (ulong)uVar1;
  }
  if ((local_c0 >> 4 < 0x10000001) && (0 < (int)local_c0)) {
    iVar4 = iVar4 - (int)local_c0;
    iVar2 = (*B->emit)(B->emit_context,local_b0,local_b8,iVar4,local_c0);
    if (iVar2 == 0) {
      B->emit_start = iVar4;
      return iVar4;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x299,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_embed_buffer(flatcc_builder_t *B,
        uint16_t block_align,
        const void *data, size_t size, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    uoffset_t size_field, pad;
    iov_state_t iov;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, !is_top_buffer(B))) {
        return 0;
    }
    pad = front_pad(B, (uoffset_t)(size + (with_size ? field_size : 0)), align);
    write_uoffset(&size_field, (uoffset_t)size + pad);
    init_iov();
    /* Add ubyte vector size header if nested buffer. */
    push_iov_cond(&size_field, field_size, !is_top_buffer(B));
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}